

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_color_stats_add(LodePNGColorStats *stats,uint r,uint g,uint b,uint a)

{
  undefined2 in_CX;
  undefined2 in_DX;
  undefined2 in_SI;
  undefined2 in_R8W;
  LodePNGColorMode mode;
  uchar image [8];
  uint error;
  LodePNGColorMode *in_stack_000000a8;
  uint in_stack_000000b0;
  uint in_stack_000000b4;
  uchar *in_stack_000000b8;
  LodePNGColorStats *in_stack_000000c0;
  LodePNGColorMode local_50;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  undefined1 local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  uint local_1c;
  undefined2 local_18;
  undefined2 local_14;
  undefined2 local_10;
  undefined2 local_c;
  
  local_1c = 0;
  local_c = in_SI;
  local_10 = in_DX;
  local_14 = in_CX;
  local_18 = in_R8W;
  lodepng_color_mode_init(&local_50);
  local_24 = (undefined1)((ushort)local_c >> 8);
  local_23 = (undefined1)local_c;
  local_22 = (undefined1)((ushort)local_10 >> 8);
  local_21 = (undefined1)local_10;
  local_20 = (undefined1)((ushort)local_14 >> 8);
  local_1f = (undefined1)local_14;
  local_1e = (undefined1)((ushort)local_18 >> 8);
  local_1d = (undefined1)local_18;
  local_50.bitdepth = 0x10;
  local_50.colortype = LCT_RGBA;
  local_1c = lodepng_compute_color_stats
                       (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0,
                        in_stack_000000a8);
  lodepng_color_mode_cleanup((LodePNGColorMode *)0x8239d1);
  return local_1c;
}

Assistant:

static unsigned lodepng_color_stats_add(LodePNGColorStats* stats,
                                        unsigned r, unsigned g, unsigned b, unsigned a) {
  unsigned error = 0;
  unsigned char image[8];
  LodePNGColorMode mode;
  lodepng_color_mode_init(&mode);
  image[0] = r >> 8; image[1] = r; image[2] = g >> 8; image[3] = g;
  image[4] = b >> 8; image[5] = b; image[6] = a >> 8; image[7] = a;
  mode.bitdepth = 16;
  mode.colortype = LCT_RGBA;
  error = lodepng_compute_color_stats(stats, image, 1, 1, &mode);
  lodepng_color_mode_cleanup(&mode);
  return error;
}